

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_vertex_id.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_6b0cf::lower_vertex_id_visitor::visit
          (lower_vertex_id_visitor *this,ir_dereference_variable *ir)

{
  ir_variable *piVar1;
  ir_expression *val;
  exec_node *local_c8;
  exec_node *local_a8;
  exec_node *local_88;
  exec_node *local_68;
  operand local_58;
  operand local_50;
  operand local_48;
  deref local_40;
  ir_assignment *local_38;
  ir_instruction *inst;
  void *mem_ctx;
  glsl_type *int_t;
  ir_dereference_variable *ir_local;
  lower_vertex_id_visitor *this_local;
  
  if (((*(uint *)&ir->var->data >> 0xc & 0xf) == 10) && ((ir->var->data).location == 9)) {
    int_t = (glsl_type *)ir;
    if (this->VertexID == (ir_variable *)0x0) {
      mem_ctx = &glsl_type::_int_type;
      ir_local = (ir_dereference_variable *)this;
      inst = (ir_instruction *)ralloc_parent(ir);
      piVar1 = (ir_variable *)exec_node::operator_new(0x90,inst);
      ir_variable::ir_variable(piVar1,(glsl_type *)mem_ctx,"__VertexID",ir_var_temporary);
      this->VertexID = piVar1;
      local_68 = (exec_node *)0x0;
      if (this->VertexID != (ir_variable *)0x0) {
        local_68 = &(this->VertexID->super_ir_instruction).super_exec_node;
      }
      exec_list::push_head(this->ir_list,local_68);
      piVar1 = (ir_variable *)exec_node::operator_new(0x90,inst);
      ir_variable::ir_variable(piVar1,(glsl_type *)mem_ctx,"gl_VertexIDMESA",ir_var_system_value);
      this->gl_VertexID = piVar1;
      *(uint *)&this->gl_VertexID->data = *(uint *)&this->gl_VertexID->data & 0xfffff3ff | 0x800;
      *(uint *)&this->gl_VertexID->data = *(uint *)&this->gl_VertexID->data & 0xfffffffe | 1;
      (this->gl_VertexID->data).location = 0xc;
      *(uint *)&this->gl_VertexID->data = *(uint *)&this->gl_VertexID->data & 0xfffbffff | 0x40000;
      *(uint *)&this->gl_VertexID->data = *(uint *)&this->gl_VertexID->data & 0xfff7ffff;
      local_88 = (exec_node *)0x0;
      if (this->gl_VertexID != (ir_variable *)0x0) {
        local_88 = &(this->gl_VertexID->super_ir_instruction).super_exec_node;
      }
      exec_list::push_head(this->ir_list,local_88);
      if (this->gl_BaseVertex == (ir_variable *)0x0) {
        piVar1 = (ir_variable *)exec_node::operator_new(0x90,inst);
        ir_variable::ir_variable(piVar1,(glsl_type *)mem_ctx,"gl_BaseVertex",ir_var_system_value);
        this->gl_BaseVertex = piVar1;
        *(uint *)&this->gl_BaseVertex->data =
             *(uint *)&this->gl_BaseVertex->data & 0xfffff3ff | 0xc00;
        *(uint *)&this->gl_BaseVertex->data = *(uint *)&this->gl_BaseVertex->data & 0xfffffffe | 1;
        (this->gl_BaseVertex->data).location = 0xd;
        *(uint *)&this->gl_BaseVertex->data =
             *(uint *)&this->gl_BaseVertex->data & 0xfffbffff | 0x40000;
        *(uint *)&this->gl_BaseVertex->data = *(uint *)&this->gl_BaseVertex->data & 0xfff7ffff;
        local_a8 = (exec_node *)0x0;
        if (this->gl_BaseVertex != (ir_variable *)0x0) {
          local_a8 = &(this->gl_BaseVertex->super_ir_instruction).super_exec_node;
        }
        exec_list::push_head(this->ir_list,local_a8);
      }
      ir_builder::deref::deref(&local_40,this->VertexID);
      ir_builder::operand::operand(&local_50,this->gl_VertexID);
      ir_builder::operand::operand(&local_58,this->gl_BaseVertex);
      val = ir_builder::add(local_50,local_58);
      ir_builder::operand::operand(&local_48,&val->super_ir_rvalue);
      local_38 = ir_builder::assign(local_40,local_48);
      local_c8 = (exec_node *)0x0;
      if (local_38 != (ir_assignment *)0x0) {
        local_c8 = &(local_38->super_ir_instruction).super_exec_node;
      }
      exec_list::push_head(&this->main_sig->body,local_c8);
    }
    int_t->mem_ctx = this->VertexID;
    (this->super_ir_hierarchical_visitor).field_0x31 = 1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
lower_vertex_id_visitor::visit(ir_dereference_variable *ir)
{
   if (ir->var->data.mode != ir_var_system_value ||
       ir->var->data.location != SYSTEM_VALUE_VERTEX_ID)
      return visit_continue;

   if (VertexID == NULL) {
      const glsl_type *const int_t = glsl_type::int_type;
      void *const mem_ctx = ralloc_parent(ir);

      VertexID = new(mem_ctx) ir_variable(int_t, "__VertexID",
                                          ir_var_temporary);
      ir_list->push_head(VertexID);

      gl_VertexID = new(mem_ctx) ir_variable(int_t, "gl_VertexIDMESA",
                                             ir_var_system_value);
      gl_VertexID->data.how_declared = ir_var_declared_implicitly;
      gl_VertexID->data.read_only = true;
      gl_VertexID->data.location = SYSTEM_VALUE_VERTEX_ID_ZERO_BASE;
      gl_VertexID->data.explicit_location = true;
      gl_VertexID->data.explicit_index = 0;
      ir_list->push_head(gl_VertexID);

      if (gl_BaseVertex == NULL) {
         gl_BaseVertex = new(mem_ctx) ir_variable(int_t, "gl_BaseVertex",
                                                  ir_var_system_value);
         gl_BaseVertex->data.how_declared = ir_var_hidden;
         gl_BaseVertex->data.read_only = true;
         gl_BaseVertex->data.location = SYSTEM_VALUE_BASE_VERTEX;
         gl_BaseVertex->data.explicit_location = true;
         gl_BaseVertex->data.explicit_index = 0;
         ir_list->push_head(gl_BaseVertex);
      }

      ir_instruction *const inst =
         ir_builder::assign(VertexID,
                            ir_builder::add(gl_VertexID, gl_BaseVertex));

      main_sig->body.push_head(inst);
   }

   ir->var = VertexID;
   progress = true;

   return visit_continue;
}